

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosserat::ComputeStiffnessMatrix
          (ChElasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_e,
          ChVector<double> *strain_k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChMatrixNM<double,_6,_6> *pCVar5;
  double *pdVar6;
  long lVar7;
  int i;
  long lVar8;
  bool bVar9;
  double invepsi;
  ChVector<double> v;
  ChVector<double> *local_168 [2];
  ChElasticityCosserat *local_158;
  ChMatrixNM<double,_6,_6> *local_150;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_90;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> local_68;
  
  invepsi = 1000000.0;
  bstress_n.m_data[0] = 0.0;
  bstress_n.m_data[1] = 0.0;
  bstress_n.m_data[2] = 0.0;
  bstress_m.m_data[0] = 0.0;
  bstress_m.m_data[1] = 0.0;
  bstress_m.m_data[2] = 0.0;
  local_a8.m_data[0] = strain_e->m_data[0];
  local_a8.m_data[1] = strain_e->m_data[1];
  local_a8.m_data[2] = strain_e->m_data[2];
  local_c8.m_data[0] = strain_k->m_data[0];
  local_c8.m_data[1] = strain_k->m_data[1];
  local_c8.m_data[2] = strain_k->m_data[2];
  local_158 = this;
  local_150 = K;
  (*this->_vptr_ChElasticityCosserat[2])();
  for (lVar8 = 0; pCVar5 = local_150, lVar8 != 3; lVar8 = lVar8 + 1) {
    pdVar6 = ChVector<double>::operator[](&local_a8,(uint)lVar8);
    *pdVar6 = *pdVar6 + 1e-06;
    (*local_158->_vptr_ChElasticityCosserat[2])(local_158,&bstress_n,&bstress_m,&local_a8,&local_c8)
    ;
    auVar3._8_8_ = bstress_n.m_data[1];
    auVar3._0_8_ = bstress_n.m_data[0];
    local_168[0] = &v;
    v.m_data._0_16_ = vsubpd_avx(auVar3,ZEXT816(0));
    v.m_data[2] = bstress_n.m_data[2] - 0.0;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_90,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
               local_168,&invepsi);
    pCVar5 = local_150;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_68,local_150,0,lVar8,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&local_68,&local_90);
    auVar1._8_8_ = bstress_m.m_data[1];
    auVar1._0_8_ = bstress_m.m_data[0];
    local_168[0] = &v;
    v.m_data._0_16_ = vsubpd_avx(auVar1,ZEXT816(0));
    v.m_data[2] = bstress_m.m_data[2] - 0.0;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_90,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
               local_168,&invepsi);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_68,pCVar5,3,lVar8,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&local_68,&local_90);
    pdVar6 = ChVector<double>::operator[](&local_a8,(uint)lVar8);
    *pdVar6 = *pdVar6 + -1e-06;
  }
  lVar7 = 0;
  lVar8 = 3;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    pdVar6 = ChVector<double>::operator[](&local_c8,(uint)lVar7);
    *pdVar6 = *pdVar6 + 1e-06;
    (*local_158->_vptr_ChElasticityCosserat[2])(local_158,&bstress_n,&bstress_m,&local_a8,&local_c8)
    ;
    auVar4._8_8_ = bstress_n.m_data[1];
    auVar4._0_8_ = bstress_n.m_data[0];
    local_168[0] = &v;
    v.m_data._0_16_ = vsubpd_avx(auVar4,ZEXT816(0));
    v.m_data[2] = bstress_n.m_data[2] - 0.0;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_90,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
               local_168,&invepsi);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_68,pCVar5,0,lVar7 + 3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&local_68,&local_90);
    auVar2._8_8_ = bstress_m.m_data[1];
    auVar2._0_8_ = bstress_m.m_data[0];
    local_168[0] = &v;
    v.m_data._0_16_ = vsubpd_avx(auVar2,ZEXT816(0));
    v.m_data[2] = bstress_m.m_data[2] - 0.0;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_90,
               (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
               local_168,&invepsi);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_68,pCVar5,3,lVar7 + 3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&local_68,&local_90);
    pdVar6 = ChVector<double>::operator[](&local_c8,(uint)lVar7);
    lVar7 = lVar7 + 1;
    *pdVar6 = *pdVar6 + -1e-06;
  }
  return;
}

Assistant:

void ChElasticityCosserat::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                  const ChVector<>& strain_e,
                                                  const ChVector<>& strain_k) {
    double epsi = 1e-6;
    double invepsi = 1.0 / epsi;
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> bstress_n;
    ChVector<> bstress_m;
    ChVector<> strain_e_inc = strain_e;
    ChVector<> strain_k_inc = strain_k;
    this->ComputeStress(astress_n, astress_m, strain_e, strain_k);
    for (int i = 0; i < 3; ++i) {
        strain_e_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
        strain_e_inc[i] -= epsi;
    }
    for (int i = 0; i < 3; ++i) {
        strain_k_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i + 3, 3, 3) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i + 3, 3, 3) = (bstress_m - astress_m).eigen() * invepsi;
        strain_k_inc[i] -= epsi;
    }
}